

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t in_RCX;
  ssize_t write_result;
  size_t size_local;
  char *data_local;
  PosixWritableFile *this_local;
  
  write_result = in_RCX;
  size_local = size;
  do {
    while( true ) {
      if (write_result == 0) {
        Status::OK();
        return (Status)(char *)this;
      }
      sVar1 = write(*(int *)(data + 0x10010),(void *)size_local,write_result);
      if (sVar1 < 0) break;
      size_local = sVar1 + size_local;
      write_result = write_result - sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  piVar2 = __errno_location();
  PosixError((anon_unknown_1 *)this,(string *)(data + 0x10018),*piVar2);
  return (Status)(char *)this;
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }